

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

bool __thiscall Protocol::MQTT::V5::WillMessage::check(WillMessage *this)

{
  PropertyBase *pPVar1;
  bool bVar2;
  PropertyBase **ppPVar3;
  
  bVar2 = Properties::check(&this->willProperties);
  if (bVar2) {
    ppPVar3 = &(this->willProperties).head;
    do {
      pPVar1 = *ppPVar3;
      if (pPVar1 == (PropertyBase *)0x0) {
        if (((this->willTopic).data == (char *)0x0) == ((this->willTopic).length != 0)) {
          return false;
        }
        return ((this->willPayload).length != 0) != ((this->willPayload).data == (uint8 *)0x0);
      }
      bVar2 = isAllowedProperty((uint)pPVar1->type,RESERVED);
      ppPVar3 = &pPVar1->next;
    } while (bVar2);
  }
  return false;
}

Assistant:

bool check() const
                {
                    if (!willProperties.check()) return false;
                    PropertyBase * u = willProperties.head;
                    while (u)
                    {   // Will properties are noted as if their control packet type was 0 (since it's reserved, let's use it)
                        if (!isAllowedProperty((PropertyType)u->type, (ControlPacketType)0)) return false;
                        u = u->next;
                    }
                    return willTopic.check() && willPayload.check();
                }